

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O0

Vector * turbulence_3d(Vector *__return_storage_ptr__,Vector *p,int octaves)

{
  Vector local_78;
  Vector local_60;
  int local_44;
  undefined1 local_40 [4];
  int i;
  Vector r;
  double k;
  int octaves_local;
  Vector *p_local;
  Vector *res;
  
  r.z = 1.0;
  Vector::Vector((Vector *)local_40,p);
  Vector::Vector(__return_storage_ptr__,0.0);
  Turbulence3dCalls = Turbulence3dCalls + 1;
  for (local_44 = 0; local_44 < octaves; local_44 = local_44 + 1) {
    noise_3d(&local_78,(Vector *)local_40);
    operator*(&local_60,&local_78,r.z);
    Vector::operator+=(__return_storage_ptr__,&local_60);
    Vector::operator*=((Vector *)local_40,2.0);
    r.z = r.z * 0.5;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector turbulence_3d( const Vector&  p, int octaves )
{
   double k = 1;
   Vector r = p;
   Vector res(0);
   int   i;

   Turbulence3dCalls++;

   for( i = 0; i <   octaves; i++ )
   {
      res   += noise_3d(r) * k;
      r *= 2;
      k *= 0.5;
   }
   return res;
}